

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O0

void __thiscall
chatra::UserObjectBase::UserObjectBase(UserObjectBase *this,Storage *storage,Class *cl)

{
  unordered_set<const_chatra::Class_*,_std::hash<const_chatra::Class_*>,_std::equal_to<const_chatra::Class_*>,_std::allocator<const_chatra::Class_*>_>
  *puVar1;
  const_iterator __first;
  const_iterator __last;
  Class *cl_local;
  Storage *storage_local;
  UserObjectBase *this_local;
  
  ObjectBase::ObjectBase(&this->super_ObjectBase,storage,Dummy,cl);
  (this->super_ObjectBase).super_Object._vptr_Object = (_func_int **)&PTR__UserObjectBase_0042a308;
  this->deinitCalled = false;
  std::unique_ptr<chatra::INativePtr,std::default_delete<chatra::INativePtr>>::
  unique_ptr<std::default_delete<chatra::INativePtr>,void>
            ((unique_ptr<chatra::INativePtr,std::default_delete<chatra::INativePtr>> *)
             &this->nativePtr);
  std::
  unordered_set<const_chatra::Class_*,_std::hash<const_chatra::Class_*>,_std::equal_to<const_chatra::Class_*>,_std::allocator<const_chatra::Class_*>_>
  ::unordered_set(&this->uninitializedParents);
  puVar1 = Class::refParents(cl);
  __first = std::
            unordered_set<const_chatra::Class_*,_std::hash<const_chatra::Class_*>,_std::equal_to<const_chatra::Class_*>,_std::allocator<const_chatra::Class_*>_>
            ::cbegin(puVar1);
  puVar1 = Class::refParents(cl);
  __last = std::
           unordered_set<const_chatra::Class_*,_std::hash<const_chatra::Class_*>,_std::equal_to<const_chatra::Class_*>,_std::allocator<const_chatra::Class_*>_>
           ::cend(puVar1);
  std::
  unordered_set<chatra::Class_const*,std::hash<chatra::Class_const*>,std::equal_to<chatra::Class_const*>,std::allocator<chatra::Class_const*>>
  ::insert<std::__detail::_Node_const_iterator<chatra::Class_const*,true,false>>
            ((unordered_set<chatra::Class_const*,std::hash<chatra::Class_const*>,std::equal_to<chatra::Class_const*>,std::allocator<chatra::Class_const*>>
              *)&this->uninitializedParents,
             (_Node_const_iterator<const_chatra::Class_*,_true,_false>)
             __first.super__Node_iterator_base<const_chatra::Class_*,_false>._M_cur,
             (_Node_const_iterator<const_chatra::Class_*,_true,_false>)
             __last.super__Node_iterator_base<const_chatra::Class_*,_false>._M_cur);
  return;
}

Assistant:

UserObjectBase(Storage& storage, const Class* cl) noexcept : ObjectBase(storage, typeId_UserObjectBase, cl) {
		uninitializedParents.insert(cl->refParents().cbegin(), cl->refParents().cend());
	}